

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_mat2quat(double *q,double *R)

{
  double dVar1;
  double _q4;
  size_t i;
  double *R_local;
  double *q_local;
  
  *q = *R + 1.0 + R[4] + R[8];
  q[1] = ((*R + 1.0) - R[4]) - R[8];
  q[2] = ((1.0 - *R) + R[4]) - R[8];
  q[3] = ((1.0 - *R) - R[4]) + R[8];
  for (_q4 = 0.0; ((ulong)_q4 < 4 && (q[(long)_q4] < 1.0)); _q4 = (double)((long)_q4 + 1)) {
  }
  dVar1 = sqrt(q[(long)_q4]);
  q[(long)_q4] = dVar1 * 0.5;
  dVar1 = 1.0 / (q[(long)_q4] * 4.0);
  switch(_q4) {
  case 0.0:
    q[1] = (R[5] - R[7]) * dVar1;
    q[2] = (R[6] - R[2]) * dVar1;
    q[3] = (R[1] - R[3]) * dVar1;
    break;
  case 4.94065645841247e-324:
    *q = (R[5] - R[7]) * dVar1;
    q[2] = (R[1] + R[3]) * dVar1;
    q[3] = (R[6] + R[2]) * dVar1;
    break;
  case 9.88131291682493e-324:
    *q = (R[6] - R[2]) * dVar1;
    q[1] = (R[1] + R[3]) * dVar1;
    q[3] = (R[5] + R[7]) * dVar1;
    break;
  case 1.48219693752374e-323:
    *q = (R[1] - R[3]) * dVar1;
    q[1] = (R[6] + R[2]) * dVar1;
    q[2] = (R[5] + R[7]) * dVar1;
    break;
  default:
    *q = 0.0;
    q[1] = 0.0;
    q[2] = 0.0;
    q[3] = 0.0;
  }
  return;
}

Assistant:

void fsnav_linal_mat2quat(double* q, double* R)
{
	size_t i;
	double _q4;

	// absolute values squared four times
	q[0] = 1 + R[0] + R[4] + R[8];
	q[1] = 1 + R[0] - R[4] - R[8];
	q[2] = 1 - R[0] + R[4] - R[8];
	q[3] = 1 - R[0] - R[4] + R[8];

	for (i = 0; i < 4; i++)
		if (q[i] >= 1)
			break;

	q[i] = sqrt(q[i])/2;
	_q4 = 1/(4*q[i]);
	switch (i) {
		case 0:
			q[1] = (R[5]-R[7])*_q4;
			q[2] = (R[6]-R[2])*_q4;
			q[3] = (R[1]-R[3])*_q4;
			break;
		case 1:
			q[0] = (R[5]-R[7])*_q4;
			q[2] = (R[1]+R[3])*_q4;
			q[3] = (R[6]+R[2])*_q4;
			break;
		case 2:
			q[0] = (R[6]-R[2])*_q4;
			q[1] = (R[1]+R[3])*_q4;
			q[3] = (R[5]+R[7])*_q4;
			break;
		case 3:
			q[0] = (R[1]-R[3])*_q4;
			q[1] = (R[6]+R[2])*_q4;
			q[2] = (R[5]+R[7])*_q4;
			break;
		default: // invalid matrix
			q[0] = 0;
			q[1] = 0;
			q[2] = 0;
			q[3] = 0;
			break;
	}
}